

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

BOOL WriteProcessMemory(HANDLE hProcess,LPVOID lpBaseAddress,LPCVOID lpBuffer,SIZE_T nSize,
                       SIZE_T *lpNumberOfBytesWritten)

{
  DWORD processId;
  DWORD DVar1;
  BOOL BVar2;
  uint mask;
  int iVar3;
  SIZE_T i;
  CPalThread *pThread;
  SIZE_T SVar4;
  ulong uVar5;
  long lVar6;
  int *pvMem;
  ulong uVar7;
  int *piVar8;
  uint uVar9;
  int *addr;
  ulong uVar11;
  SIZE_T local_40;
  Volatile<unsigned_long> numberOfBytesWritten;
  Volatile<int> ret;
  ulong uVar10;
  
  numberOfBytesWritten.m_val._0_4_ = 0;
  local_40 = 0;
  if (PAL_InitializeChakraCoreCalled) {
    pThread = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pThread == (CPalThread *)0x0) {
      pThread = CreateCurrentThreadData();
    }
    if ((nSize == 0) || (processId = PROCGetProcessIDFromHandle(hProcess), processId == 0)) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_003264a7;
      SetLastError(0x57);
    }
    else {
      DVar1 = GetCurrentProcessId();
      if (DVar1 == processId) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_003264a7;
        SVar4 = 0;
        do {
          *(undefined1 *)((long)lpBaseAddress + SVar4) = *(undefined1 *)((long)lpBuffer + SVar4);
          SVar4 = SVar4 + 1;
        } while (nSize != SVar4);
        numberOfBytesWritten.m_val._0_4_ = 1;
        local_40 = nSize;
      }
      else {
        BVar2 = DBGAttachProcess(pThread,hProcess,processId);
        if (BVar2 != 0) {
          uVar9 = (uint)lpBaseAddress & 3;
          uVar10 = (ulong)uVar9;
          uVar9 = -1 << (char)uVar9 * '\b';
          uVar5 = uVar10 + nSize >> 2;
          uVar11 = uVar10 + nSize & 3;
          uVar7 = (ulong)(uVar11 != 0);
          lVar6 = uVar5 + uVar7;
          pvMem = (int *)CorUnix::InternalMalloc(lVar6 * 4);
          if (pvMem == (int *)0x0) {
            if (PAL_InitializeChakraCoreCalled == false) goto LAB_003264a7;
            SetLastError(8);
          }
          else {
            memcpy((void *)((long)pvMem + uVar10),lpBuffer,nSize);
            mask = 0xffffffff >> (-(char)((int)uVar11 << 3) & 0x1fU);
            if (lVar6 == 1) {
              iVar3 = DBGWriteProcMem_IntWithMask
                                (processId,(int *)((ulong)lpBaseAddress & 0xfffffffffffffffc),*pvMem
                                 ,mask & uVar9);
joined_r0x0032646a:
              if (iVar3 != 0) {
                numberOfBytesWritten.m_val._0_4_ = 1;
                local_40 = nSize;
              }
            }
            else {
              iVar3 = DBGWriteProcMem_IntWithMask
                                (processId,(int *)((ulong)lpBaseAddress & 0xfffffffffffffffc),*pvMem
                                 ,uVar9);
              if (iVar3 != 0) {
                addr = (int *)((long)lpBaseAddress - uVar10);
                uVar5 = uVar5 + uVar7;
                piVar8 = pvMem;
                do {
                  uVar5 = uVar5 - 1;
                  addr = addr + 1;
                  piVar8 = piVar8 + 1;
                  if (uVar5 < 2) {
                    iVar3 = DBGWriteProcMem_IntWithMask(processId,addr,*piVar8,mask);
                    goto joined_r0x0032646a;
                  }
                  iVar3 = DBGWriteProcMem_Int(processId,addr,*piVar8);
                } while (iVar3 != 0);
              }
            }
            CorUnix::InternalFree(pvMem);
          }
          BVar2 = DBGDetachProcess(pThread,hProcess,processId);
          if (BVar2 == 0) {
            numberOfBytesWritten.m_val._0_4_ = 0;
          }
        }
      }
    }
    if (lpNumberOfBytesWritten != (SIZE_T *)0x0) {
      *lpNumberOfBytesWritten = local_40;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return (BOOL)numberOfBytesWritten.m_val;
    }
  }
LAB_003264a7:
  abort();
}

Assistant:

BOOL
PALAPI
WriteProcessMemory(
           IN HANDLE hProcess,
           IN LPVOID lpBaseAddress,
           IN LPCVOID lpBuffer,
           IN SIZE_T nSize,
           OUT SIZE_T * lpNumberOfBytesWritten
           )

{
    CPalThread *pThread;
    DWORD processId;
    Volatile<BOOL> ret = FALSE;
    Volatile<SIZE_T> numberOfBytesWritten = 0;
#if HAVE_VM_READ
    kern_return_t result;
    vm_map_t task;
#elif HAVE_PROCFS_CTL
    int fd;
    char memPath[64];
    LONG_PTR bytesWritten;
    off_t offset;
#elif !HAVE_TTRACE
    SIZE_T FirstIntOffset;
    SIZE_T LastIntOffset;
    unsigned int FirstIntMask;
    unsigned int LastIntMask;
    SIZE_T nbInts;
    int *lpTmpBuffer = 0, *lpInt;
    int* lpBaseAddressAligned;
#endif

    PERF_ENTRY(WriteProcessMemory);
    ENTRY("WriteProcessMemory (hProcess=%p,lpBaseAddress=%p, lpBuffer=%p, "
           "nSize=%u, lpNumberOfBytesWritten=%p)\n",
           hProcess,lpBaseAddress, lpBuffer, (unsigned int)nSize, lpNumberOfBytesWritten);

    pThread = InternalGetCurrentThread();

    if (!(nSize && (processId = PROCGetProcessIDFromHandle(hProcess))))
    {
        ERROR("Invalid nSize:%u number or invalid process handler "
              "hProcess:%p\n", (unsigned int)nSize, hProcess);
        SetLastError(ERROR_INVALID_PARAMETER);
        goto EXIT;
    }

    // Check if the write request is for the current process.
    // In that case we don't need ptrace.
    if (GetCurrentProcessId() == processId)
    {
        TRACE("We are in the same process so we don't need ptrace\n");

        struct Param
        {
            LPVOID lpBaseAddress;
            LPCVOID lpBuffer;
            SIZE_T nSize;
            SIZE_T numberOfBytesWritten;
            BOOL ret;
        } param;
        param.lpBaseAddress = lpBaseAddress;
        param.lpBuffer = lpBuffer;
        param.nSize = nSize;
        param.numberOfBytesWritten = numberOfBytesWritten;
        param.ret = ret;

        {
            SIZE_T i;

            // Seg fault in memcpy can't be caught
            // so we simulate the memcpy here

            for (i = 0; i<param.nSize; i++)
            {
                *((char*)(param.lpBaseAddress)+i) = *((char*)(param.lpBuffer)+i);
            }

            param.numberOfBytesWritten = param.nSize;
            param.ret = TRUE;
        }

        numberOfBytesWritten = param.numberOfBytesWritten;
        ret = param.ret;
        goto EXIT;
    }

#if HAVE_VM_READ
    result = task_for_pid(mach_task_self(), processId, &task);
    if (result != KERN_SUCCESS)
    {
        ERROR("No Mach task for pid %d: %d\n", processId, ret.Load());
        SetLastError(ERROR_INVALID_HANDLE);
        goto EXIT;
    }
    result = vm_write(task, (vm_address_t) lpBaseAddress,
                      (vm_address_t) lpBuffer, nSize);
    if (result != KERN_SUCCESS)
    {
        ERROR("vm_write failed for %d bytes from %p in %d: %d\n",
              (int)nSize, lpBaseAddress, task, result);
        if (result <= KERN_RETURN_MAX)
        {
            SetLastError(ERROR_ACCESS_DENIED);
        }
        else
        {
            SetLastError(ERROR_INTERNAL_ERROR);
        }
        goto EXIT;
    }
    numberOfBytesWritten = nSize;
    ret = TRUE;
#else   // HAVE_VM_READ
#if HAVE_PROCFS_CTL
    snprintf(memPath, sizeof(memPath), "/proc/%u/%s", processId, PROCFS_MEM_NAME);
    fd = InternalOpen(memPath, O_WRONLY);
    if (fd == -1)
    {
        ERROR("Failed to open %s\n", memPath);
        SetLastError(ERROR_INVALID_ACCESS);
        goto PROCFSCLEANUP;
    }

    //
    // off_t may be greater in size than void*, so first cast to
    // an unsigned type to ensure that no sign extension takes place
    //

    offset = (off_t) (UINT_PTR) lpBaseAddress;

    if (lseek(fd, offset, SEEK_SET) == -1)
    {
        ERROR("Failed to seek to base address\n");
        SetLastError(ERROR_INVALID_ACCESS);
        goto PROCFSCLEANUP;
    }

    bytesWritten = write(fd, lpBuffer, nSize);
    if (bytesWritten < 0)
    {
        ERROR("Failed to write to %s\n", memPath);
        SetLastError(ERROR_INVALID_ACCESS);
        goto PROCFSCLEANUP;
    }

    numberOfBytesWritten = bytesWritten;
    ret = TRUE;

#else   // HAVE_PROCFS_CTL
    /* Attach the process before calling ptrace otherwise it fails */
    if (DBGAttachProcess(pThread, hProcess, processId))
    {
#if HAVE_TTRACE
        if (ttrace(TT_PROC_WRDATA, processId, 0, (__uint64_t)lpBaseAddress, (__uint64_t)nSize, (__uint64_t)lpBuffer) == -1)
        {
            if (errno == EFAULT)
            {
                ERROR("ttrace(TT_PROC_WRDATA, pid:%d, addr:%p, data:%d, addr2:%d) failed"
                      " errno=%d (%s)\n", processId, lpBaseAddress, nSize, lpBuffer,
                      errno, strerror(errno));

                SetLastError(ERROR_ACCESS_DENIED);
            }
            else
            {
                ASSERT("ttrace(TT_PROC_WRDATA, pid:%d, addr:%p, data:%d, addr2:%d) failed"
                      " errno=%d (%s)\n", processId, lpBaseAddress, nSize, lpBuffer,
                      errno, strerror(errno));
                SetLastError(ERROR_INTERNAL_ERROR);
            }

            goto CLEANUP1;
        }

        numberOfBytesWritten = nSize;
        ret = TRUE;

#else   // HAVE_TTRACE

        FirstIntOffset = (SIZE_T)lpBaseAddress % sizeof(int);
        FirstIntMask = -1;
        FirstIntMask <<= (FirstIntOffset * 8);

        nbInts = (nSize + FirstIntOffset) / sizeof(int) +
                 (((nSize + FirstIntOffset)%sizeof(int)) ? 1:0);
        lpBaseAddressAligned = (int*)((char*)lpBaseAddress - FirstIntOffset);

        if ((lpTmpBuffer = (int*)InternalMalloc((nbInts * sizeof(int)))) == NULL)
        {
            ERROR("Insufficient memory available !\n");
            SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            goto CLEANUP1;
        }

        memcpy((char *)lpTmpBuffer + FirstIntOffset, (char *)lpBuffer, nSize);
        lpInt = lpTmpBuffer;

        LastIntOffset = (nSize + FirstIntOffset) % sizeof(int);
        LastIntMask = -1;
        LastIntMask >>= ((sizeof(int) - LastIntOffset) * 8);

        if (nbInts == 1)
        {
            if (DBGWriteProcMem_IntWithMask(processId, lpBaseAddressAligned,
                                            *lpInt,
                                            LastIntMask & FirstIntMask)
                  == 0)
            {
                goto CLEANUP2;
            }
            numberOfBytesWritten = nSize;
            ret = TRUE;
            goto CLEANUP2;
        }

        if (DBGWriteProcMem_IntWithMask(processId,
                                        lpBaseAddressAligned++,
                                        *lpInt++, FirstIntMask)
            == 0)
        {
            goto CLEANUP2;
        }

        while (--nbInts > 1)
        {
          if (DBGWriteProcMem_Int(processId, lpBaseAddressAligned++,
                                  *lpInt++) == 0)
          {
              goto CLEANUP2;
          }
        }

        if (DBGWriteProcMem_IntWithMask(processId, lpBaseAddressAligned,
                                        *lpInt, LastIntMask ) == 0)
        {
            goto CLEANUP2;
        }

        numberOfBytesWritten = nSize;
        ret = TRUE;
#endif  // HAVE_TTRACE
    }
    else
    {
        /* Failed to attach processId */
        goto EXIT;
    }
#endif // HAVE_PROCFS_CTL

#if HAVE_PROCFS_CTL
PROCFSCLEANUP:
    if (fd != -1)
    {
        close(fd);
    }
#elif !HAVE_TTRACE
CLEANUP2:
    if (lpTmpBuffer)
    {
        InternalFree(lpTmpBuffer);
    }
#endif  // !HAVE_TTRACE

#if !HAVE_PROCFS_CTL
CLEANUP1:
    if (!DBGDetachProcess(pThread, hProcess, processId))
    {
        /* Failed to detach processId */
        ret = FALSE;
    }
#endif  // !HAVE_PROCFS_CTL
#endif  // HAVE_VM_READ

EXIT:
    if (lpNumberOfBytesWritten)
    {
        *lpNumberOfBytesWritten = numberOfBytesWritten;
    }

    LOGEXIT("WriteProcessMemory returns BOOL %d\n", ret.Load());
    PERF_EXIT(WriteProcessMemory);
    return ret;
}